

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

errr finish_parse_lore(parser *p)

{
  wchar_t wVar1;
  monster_lore *lore;
  monster_race *race;
  monster_race *pmVar2;
  int local_34;
  monster_friends *pmStack_30;
  wchar_t j;
  monster_friends *f;
  monster_race *r;
  monster_lore *l;
  size_t i;
  parser *p_local;
  
  for (l = (monster_lore *)0x0; l < (monster_lore *)(ulong)z_info->r_max;
      l = (monster_lore *)((long)&l->ridx + 1)) {
    lore = l_list + (long)l;
    race = r_info + (long)l;
    if (race->base != (monster_base *)0x0) {
      flag_union(lore->flags,race->base->flags,0xb);
    }
    local_34 = 0;
    while ((local_34 < (int)(uint)z_info->mon_blows_max && (race->blow != (monster_blow *)0x0))) {
      if ((race->blow[local_34].effect == (blow_effect_conflict *)0x0) &&
         (race->blow[local_34].method == (blow_method_conflict *)0x0)) {
        lore->blows[local_34].times_seen = 0;
      }
      local_34 = local_34 + 1;
    }
    for (pmStack_30 = lore->friends; pmStack_30 != (monster_friends *)0x0;
        pmStack_30 = pmStack_30->next) {
      wVar1 = my_stricmp(pmStack_30->name,"same");
      if (wVar1 == L'\0') {
        pmStack_30->race = race;
      }
      else {
        pmVar2 = lookup_monster(pmStack_30->name);
        pmStack_30->race = pmVar2;
      }
      string_free(pmStack_30->name);
    }
    lore_update(race,(monster_lore_conflict *)lore);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_lore(struct parser *p) {
	size_t i;

	/* Processing */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_lore *l = &l_list[i];
		struct monster_race *r = &r_info[i];
		struct monster_friends *f;
		int j;

		/* Base flag knowledge */
		if (r->base) {
			rf_union(l->flags, r->base->flags);
		}

		/* Remove blows data for non-blows */
		for (j = 0; j < z_info->mon_blows_max; j++) {
			if (!r->blow) break;
			if (!(r->blow[j].effect || r->blow[j].method))
				l->blows[j].times_seen = 0;
		}

	   /* Convert friend names into race pointers - failure leaves NULL race */
		for (f = l->friends; f; f = f->next) {
			if (!my_stricmp(f->name, "same"))
				f->race = r;
			else
				f->race = lookup_monster(f->name);

			string_free(f->name);
		}

		/* update any derived values */
		lore_update(r, l);
	}

	parser_destroy(p);
	return 0;
}